

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ListValueStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  BaseStatistics *this_01;
  reference other;
  size_type __n;
  BaseStatistics list_stats;
  LogicalType LStack_98;
  BaseStatistics local_80;
  
  this_00 = input->child_stats;
  LogicalType::LogicalType(&LStack_98,&(input->expr->super_Expression).return_type);
  ListStats::CreateEmpty(&local_80,&LStack_98);
  LogicalType::~LogicalType(&LStack_98);
  this_01 = ListStats::GetChildStats(&local_80);
  if ((this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      other = vector<duckdb::BaseStatistics,_true>::operator[](this_00,__n);
      BaseStatistics::Merge(this_01,other);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this_00->
                                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ).
                                  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ).
                                  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x2e8ba2e8ba2e8ba3));
  }
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_80);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> ListValueStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto list_stats = ListStats::CreateEmpty(expr.return_type);
	auto &list_child_stats = ListStats::GetChildStats(list_stats);
	for (idx_t i = 0; i < child_stats.size(); i++) {
		list_child_stats.Merge(child_stats[i]);
	}
	return list_stats.ToUnique();
}